

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::QPDFPageObjectHelper(QPDFPageObjectHelper *this,QPDFObjectHandle *oh)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)oh);
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,(QPDFObjectHandle *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFPageObjectHelper_002ad058;
  (this->m).super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m).super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

QPDFPageObjectHelper::QPDFPageObjectHelper(QPDFObjectHandle oh) :
    QPDFObjectHelper(oh)
{
}